

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void SplitUVRow_SSE2(uint8_t *src_uv,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  uint8_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  int iVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  
  lVar22 = (long)dst_v - (long)dst_u;
  do {
    auVar2 = *(undefined1 (*) [16])src_uv;
    auVar3 = *(undefined1 (*) [16])((long)src_uv + 0x10);
    src_uv = (uint8_t *)((long)src_uv + 0x20);
    auVar23[8] = 0xff;
    auVar23._0_8_ = 0xff00ff00ff00ff;
    auVar23[9] = 0;
    auVar23[10] = 0xff;
    auVar23[0xb] = 0;
    auVar23[0xc] = 0xff;
    auVar23[0xd] = 0;
    auVar23[0xe] = 0xff;
    auVar23[0xf] = 0;
    auVar23 = auVar2 & auVar23;
    auVar24[8] = 0xff;
    auVar24._0_8_ = 0xff00ff00ff00ff;
    auVar24[9] = 0;
    auVar24[10] = 0xff;
    auVar24[0xb] = 0;
    auVar24[0xc] = 0xff;
    auVar24[0xd] = 0;
    auVar24[0xe] = 0xff;
    auVar24[0xf] = 0;
    auVar24 = auVar3 & auVar24;
    uVar5 = auVar23._0_2_;
    uVar6 = auVar23._2_2_;
    uVar7 = auVar23._4_2_;
    uVar8 = auVar23._6_2_;
    sVar9 = auVar23._8_2_;
    sVar10 = auVar23._10_2_;
    sVar11 = auVar23._12_2_;
    sVar12 = auVar23._14_2_;
    uVar13 = auVar24._0_2_;
    uVar14 = auVar24._2_2_;
    uVar15 = auVar24._4_2_;
    uVar16 = auVar24._6_2_;
    sVar17 = auVar24._8_2_;
    sVar18 = auVar24._10_2_;
    sVar19 = auVar24._12_2_;
    sVar20 = auVar24._14_2_;
    uVar25 = auVar2._0_2_ >> 8;
    uVar26 = auVar2._2_2_ >> 8;
    uVar27 = auVar2._4_2_ >> 8;
    uVar28 = auVar2._6_2_ >> 8;
    uVar29 = auVar2._8_2_ >> 8;
    uVar30 = auVar2._10_2_ >> 8;
    uVar31 = auVar2._12_2_ >> 8;
    uVar32 = auVar2._14_2_ >> 8;
    uVar33 = auVar3._0_2_ >> 8;
    uVar34 = auVar3._2_2_ >> 8;
    uVar35 = auVar3._4_2_ >> 8;
    uVar36 = auVar3._6_2_ >> 8;
    uVar37 = auVar3._8_2_ >> 8;
    uVar38 = auVar3._10_2_ >> 8;
    uVar39 = auVar3._12_2_ >> 8;
    uVar40 = auVar3._14_2_ >> 8;
    *dst_u = (uVar5 != 0) * (uVar5 < 0x100) * auVar23[0] - (0xff < uVar5);
    dst_u[1] = (uVar6 != 0) * (uVar6 < 0x100) * auVar23[2] - (0xff < uVar6);
    dst_u[2] = (uVar7 != 0) * (uVar7 < 0x100) * auVar23[4] - (0xff < uVar7);
    dst_u[3] = (uVar8 != 0) * (uVar8 < 0x100) * auVar23[6] - (0xff < uVar8);
    dst_u[4] = (0 < sVar9) * (sVar9 < 0x100) * auVar23[8] - (0xff < sVar9);
    dst_u[5] = (0 < sVar10) * (sVar10 < 0x100) * auVar23[10] - (0xff < sVar10);
    dst_u[6] = (0 < sVar11) * (sVar11 < 0x100) * auVar23[0xc] - (0xff < sVar11);
    dst_u[7] = (0 < sVar12) * (sVar12 < 0x100) * auVar23[0xe] - (0xff < sVar12);
    dst_u[8] = (uVar13 != 0) * (uVar13 < 0x100) * auVar24[0] - (0xff < uVar13);
    dst_u[9] = (uVar14 != 0) * (uVar14 < 0x100) * auVar24[2] - (0xff < uVar14);
    dst_u[10] = (uVar15 != 0) * (uVar15 < 0x100) * auVar24[4] - (0xff < uVar15);
    dst_u[0xb] = (uVar16 != 0) * (uVar16 < 0x100) * auVar24[6] - (0xff < uVar16);
    dst_u[0xc] = (0 < sVar17) * (sVar17 < 0x100) * auVar24[8] - (0xff < sVar17);
    dst_u[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar24[10] - (0xff < sVar18);
    dst_u[0xe] = (0 < sVar19) * (sVar19 < 0x100) * auVar24[0xc] - (0xff < sVar19);
    dst_u[0xf] = (0 < sVar20) * (sVar20 < 0x100) * auVar24[0xe] - (0xff < sVar20);
    puVar1 = dst_u + lVar22;
    *puVar1 = (uVar25 != 0) * (uVar25 < 0x100) * auVar2[1] - (0xff < uVar25);
    puVar1[1] = (uVar26 != 0) * (uVar26 < 0x100) * auVar2[3] - (0xff < uVar26);
    puVar1[2] = (uVar27 != 0) * (uVar27 < 0x100) * auVar2[5] - (0xff < uVar27);
    puVar1[3] = (uVar28 != 0) * (uVar28 < 0x100) * auVar2[7] - (0xff < uVar28);
    puVar1[4] = (uVar29 != 0) * (uVar29 < 0x100) * auVar2[9] - (0xff < uVar29);
    puVar1[5] = (uVar30 != 0) * (uVar30 < 0x100) * auVar2[0xb] - (0xff < uVar30);
    puVar1[6] = (uVar31 != 0) * (uVar31 < 0x100) * auVar2[0xd] - (0xff < uVar31);
    puVar1[7] = (uVar32 != 0) * (uVar32 < 0x100) * auVar2[0xf] - (0xff < uVar32);
    puVar1[8] = (uVar33 != 0) * (uVar33 < 0x100) * auVar3[1] - (0xff < uVar33);
    puVar1[9] = (uVar34 != 0) * (uVar34 < 0x100) * auVar3[3] - (0xff < uVar34);
    puVar1[10] = (uVar35 != 0) * (uVar35 < 0x100) * auVar3[5] - (0xff < uVar35);
    puVar1[0xb] = (uVar36 != 0) * (uVar36 < 0x100) * auVar3[7] - (0xff < uVar36);
    puVar1[0xc] = (uVar37 != 0) * (uVar37 < 0x100) * auVar3[9] - (0xff < uVar37);
    puVar1[0xd] = (uVar38 != 0) * (uVar38 < 0x100) * auVar3[0xb] - (0xff < uVar38);
    puVar1[0xe] = (uVar39 != 0) * (uVar39 < 0x100) * auVar3[0xd] - (0xff < uVar39);
    puVar1[0xf] = (uVar40 != 0) * (uVar40 < 0x100) * auVar3[0xf] - (0xff < uVar40);
    dst_u = dst_u + 0x10;
    iVar21 = width + -0x10;
    bVar4 = 0xf < width;
    width = iVar21;
  } while (iVar21 != 0 && bVar4);
  return;
}

Assistant:

void SplitUVRow_SSE2(const uint8_t* src_uv,
                     uint8_t* dst_u,
                     uint8_t* dst_v,
                     int width) {
  asm volatile(
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "psrlw       $0x8,%%xmm5                   \n"
      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "movdqa      %%xmm0,%%xmm2                 \n"
      "movdqa      %%xmm1,%%xmm3                 \n"
      "pand        %%xmm5,%%xmm0                 \n"
      "pand        %%xmm5,%%xmm1                 \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "psrlw       $0x8,%%xmm2                   \n"
      "psrlw       $0x8,%%xmm3                   \n"
      "packuswb    %%xmm3,%%xmm2                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "movdqu      %%xmm2,0x00(%1,%2,1)          \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x10,%3                      \n"
      "jg          1b                            \n"
      : "+r"(src_uv),  // %0
        "+r"(dst_u),   // %1
        "+r"(dst_v),   // %2
        "+r"(width)    // %3
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm5");
}